

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::GetNode
          (TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_> *this,int key)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
LAB_002f616f:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,key);
        (pNVar2->Pair).Value.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
      }
      return pNVar2;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_002f616f;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}